

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

void hmm_normalize(hmm_t *h,int32 bestscr)

{
  int local_18;
  int32 i;
  int32 bestscr_local;
  hmm_t *h_local;
  
  for (local_18 = 0; local_18 < (int)(uint)h->n_emit_state; local_18 = local_18 + 1) {
    if (-0x38000000 < h->state[local_18].score) {
      h->state[local_18].score = h->state[local_18].score - bestscr;
    }
  }
  if (-0x38000000 < (h->out).score) {
    (h->out).score = (h->out).score - bestscr;
  }
  return;
}

Assistant:

void
hmm_normalize(hmm_t *h, int32 bestscr)
{
    int32 i;

    for (i = 0; i < hmm_n_emit_state(h); i++) {
        if (hmm_score(h, i) > WORST_SCORE)
            hmm_score(h, i) -= bestscr;
    }
    if (hmm_out_score(h) > WORST_SCORE)
        hmm_out_score(h) -= bestscr;
}